

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t open_on_current_dir(tree *t,char *path,wchar_t flags)

{
  wchar_t wVar1;
  wchar_t flags_local;
  char *path_local;
  tree *t_local;
  
  wVar1 = tree_current_dir_fd(t);
  wVar1 = openat(wVar1,path,flags);
  return wVar1;
}

Assistant:

static int
open_on_current_dir(struct tree *t, const char *path, int flags)
{
#ifdef HAVE_OPENAT
	return (openat(tree_current_dir_fd(t), path, flags));
#else
	if (tree_enter_working_dir(t) != 0)
		return (-1);
	return (open(path, flags));
#endif
}